

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O2

void CB_ADF::output_rank_example(vw *all,cb_adf *c,example *ec,multi_ex *ec_seq)

{
  polyprediction *a_s;
  v_array<char> *pvVar1;
  int iVar2;
  wclass *pwVar3;
  wclass *pwVar4;
  int *piVar5;
  _func_void_int_string_v_array<char> *p_Var6;
  v_array<char> vVar7;
  bool bVar8;
  byte bVar9;
  ostream *poVar10;
  long lVar11;
  int *piVar12;
  float *pfVar13;
  undefined7 in_stack_fffffffffffffde8;
  vw *pvVar14;
  string local_1f8 [32];
  string outputString;
  stringstream outputStringStream;
  ostream local_1a8;
  
  pwVar3 = (ec->l).cs.costs._begin;
  pwVar4 = (ec->l).cs.costs._end;
  bVar8 = CB_ALGS::example_is_newline_not_header(ec);
  if (!bVar8) {
    bVar9 = update_statistics(all,c,ec,ec_seq);
    piVar5 = (all->final_prediction_sink)._end;
    a_s = &ec->pred;
    pvVar1 = &ec->tag;
    for (piVar12 = (all->final_prediction_sink)._begin; piVar12 != piVar5; piVar12 = piVar12 + 1) {
      ACTION_SCORE::print_action_score
                (*piVar12,(v_array<ACTION_SCORE::action_score> *)&a_s->scalars,pvVar1);
    }
    if (0 < all->raw_prediction) {
      outputString._M_dataplus._M_p = (pointer)&outputString.field_2;
      outputString._M_string_length = 0;
      outputString.field_2._M_local_buf[0] = '\0';
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&outputStringStream,(string *)&outputString,_S_out|_S_in);
      pfVar13 = &pwVar3->wap_value;
      for (lVar11 = 0; (long)pwVar4 - (long)pwVar3 >> 4 != lVar11; lVar11 = lVar11 + 1) {
        if (lVar11 != 0) {
          std::operator<<(&local_1a8,' ');
        }
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        poVar10 = std::operator<<(poVar10,':');
        std::ostream::operator<<(poVar10,*pfVar13);
        pfVar13 = pfVar13 + 4;
      }
      p_Var6 = all->print_text;
      iVar2 = all->raw_prediction;
      pvVar14 = all;
      std::__cxx11::stringbuf::str();
      vVar7._begin._7_1_ = bVar9;
      vVar7._begin._0_7_ = in_stack_fffffffffffffde8;
      vVar7._end = (char *)ec;
      vVar7.end_array = (char *)ec_seq;
      vVar7.erase_count = (size_t)pvVar14;
      (*p_Var6)(iVar2,(string)*pvVar1,vVar7);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&outputStringStream);
      std::__cxx11::string::~string((string *)&outputString);
    }
    CB::print_update(all,(bool)(bVar9 ^ 1),ec,ec_seq,true);
  }
  return;
}

Assistant:

void output_rank_example(vw& all, cb_adf& c, example& ec, multi_ex* ec_seq)
{
  label& ld = ec.l.cb;
  v_array<CB::cb_class> costs = ld.costs;

  if (example_is_newline_not_header(ec))
    return;

  bool labeled_example = update_statistics(all, c, ec, ec_seq);

  for (int sink : all.final_prediction_sink) print_action_score(sink, ec.pred.a_s, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].action << ':' << costs[i].partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  CB::print_update(all, !labeled_example, ec, ec_seq, true);
}